

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O0

void anon_unknown.dwarf_1bdff2::readCopyRead(string *tempDir,char *infilename,uint correctChecksum)

{
  ostream *poVar1;
  char *__filename;
  uint in_stack_00000014;
  int *in_stack_00000018;
  int *in_stack_00000020;
  Array2D<Imf_3_2::Rgba> *in_stack_00000028;
  char *in_stack_00000030;
  Array2D<Imf_3_2::Rgba> pixels2;
  int ys;
  int xs;
  Array2D<Imf_3_2::Rgba> pixels;
  int h;
  int w;
  string outfilename;
  int *in_stack_000000e8;
  int *in_stack_000000f0;
  int *in_stack_000000f8;
  Array2D<Imf_3_2::Rgba> *in_stack_00000100;
  Array2D<Imf_3_2::Rgba> *in_stack_00000108;
  char *in_stack_00000110;
  int *in_stack_00000120;
  int *in_stack_000001b8;
  int *in_stack_000001c0;
  int *in_stack_000001c8;
  int *in_stack_000001d0;
  Array2D<Imf_3_2::Rgba> *in_stack_000001d8;
  char *in_stack_000001e0;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  long in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar2;
  int local_68;
  string local_38 [56];
  
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
             ,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  poVar1 = std::operator<<((ostream *)&std::cout,"   reading, ");
  std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  readImage(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
            in_stack_00000014);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  for (local_68 = 1; local_68 < 3; local_68 = local_68 + 1) {
    for (iVar2 = 1; iVar2 < 3; iVar2 = iVar2 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"   x sampling ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_68);
      poVar1 = std::operator<<(poVar1,", y sampling ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      poVar1 = std::operator<<(poVar1,": writing image, ");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
      std::__cxx11::string::c_str();
      writeImage(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                 in_stack_000001c0,in_stack_000001b8);
      Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
                ((Array2D<Imf_3_2::Rgba> *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff40 =
           (Array2D<Imf_3_2::Rgba> *)std::operator<<((ostream *)&std::cout,"reading back, ");
      std::ostream::operator<<(in_stack_ffffffffffffff40,std::flush<char,std::char_traits<char>>);
      std::__cxx11::string::c_str();
      readBackImage(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
                    in_stack_000000f0,in_stack_000000e8,in_stack_00000120);
      __filename = (char *)std::__cxx11::string::c_str();
      remove(__filename);
      Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_ffffffffffffff40);
    }
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
readCopyRead (
    const std::string& tempDir,
    const char*        infilename,
    unsigned int       correctChecksum)
{
    std::string outfilename = tempDir + "imf_test_native.exr";

    int                                  w, h;
    Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels (1, 1);

    cout << "   reading, " << flush;
    readImage (infilename, pixels, w, h, correctChecksum);
    cout << endl;

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {
            cout << "   x sampling " << xs << ", y sampling " << ys
                 << ": writing image, " << flush;
            writeImage (outfilename.c_str (), pixels, w, h, xs, ys);

            Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (1, 1);
            cout << "reading back, " << flush;
            readBackImage (outfilename.c_str (), pixels2, pixels, w, h, xs, ys);

            remove (outfilename.c_str ());
        }
    }
}